

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O2

void zerohyp_multi(int N,double *b,int p,double *varcovar,double *tval,double *pval)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)p;
  if (p < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    dVar4 = b[uVar2];
    dVar3 = *varcovar;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    tval[uVar2] = ABS(dVar4) / dVar3;
    dVar4 = tcdf(ABS(ABS(dVar4) / dVar3),N - p);
    pval[uVar2] = 1.0 - dVar4;
    varcovar = varcovar + (p + 1);
  }
  return;
}

Assistant:

void zerohyp_multi(int N, double *b, int p, double *varcovar, double *tval, double *pval) {
	int df, i;
	/*
	* Zero Hypothesis Test for CLRM
	*/

	df = N - p;

	for (i = 0; i < p; ++i) {
		tval[i] = fabs(b[i]) / sqrt(varcovar[(p + 1)*i]);
		pval[i] = 1.0 - tcdf(fabs(tval[i]), df);
	}

}